

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetPitch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  uint uVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  AActor *pAVar7;
  char *pcVar8;
  bool bVar9;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar7 = (AActor *)(param->field_0).field_1.a;
      if (pAVar7 != (AActor *)0x0) {
        if ((pAVar7->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          (pAVar7->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar7->super_DThinker).super_DObject.Class;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d8b50;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          pvVar1 = param[1].field_0.field_1.a;
          if (numparam < 3) {
            pVVar6 = defaultparam->Array;
            if (pVVar6[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003d8b6f;
            }
          }
          else {
            pVVar6 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003d8b6f:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1277,
                            "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          uVar2 = pVVar6[2].field_0.i;
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') goto LAB_003d8acb;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
LAB_003d8acb:
              pAVar7 = COPY_AAPTR(pAVar7,param[3].field_0.i);
              if (pAVar7 != (AActor *)0x0) {
                local_30.Degrees = (double)pvVar1;
                AActor::SetPitch(pAVar7,&local_30,SUB41((uVar2 & 2) >> 1,0),(bool)((byte)uVar2 & 1))
                ;
              }
              return 0;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1278,
                        "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1276,
                    "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d8b50:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1275,
                "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetPitch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(pitch);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref != NULL)
	{
		ref->SetPitch(pitch, !!(flags & SPF_INTERPOLATE), !!(flags & SPF_FORCECLAMP));
	}
	return 0;
}